

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_line.h
# Opt level: O0

void charls::transform_triplet_to_line<charls::transform_hp2<unsigned_char>,unsigned_char>
               (triplet<unsigned_char> *source,size_t pixel_stride_in,uchar *destination,
               size_t pixel_stride,transform_hp2<unsigned_char> *transform,uint32_t mask)

{
  undefined2 uVar1;
  ulong uVar2;
  size_t sVar3;
  triplet<unsigned_char> tVar4;
  unsigned_long *puVar5;
  anon_union_1_2_7f9ecd68_for_triplet<unsigned_char>_1 local_57;
  anon_union_1_2_7f9ecc14_for_triplet<unsigned_char>_3 aStack_56;
  byte local_54;
  byte bStack_53;
  triplet<unsigned_char> color_transformed;
  triplet<unsigned_char> color;
  ulong uStack_50;
  size_t i;
  triplet<unsigned_char> *type_buffer_in;
  unsigned_long pixel_count;
  uint32_t mask_local;
  transform_hp2<unsigned_char> *transform_local;
  size_t pixel_stride_local;
  uchar *destination_local;
  size_t pixel_stride_in_local;
  triplet<unsigned_char> *source_local;
  
  transform_local = (transform_hp2<unsigned_char> *)pixel_stride;
  pixel_stride_local = (size_t)destination;
  destination_local = (uchar *)pixel_stride_in;
  pixel_stride_in_local = (size_t)source;
  puVar5 = std::min<unsigned_long>
                     ((unsigned_long *)&transform_local,(unsigned_long *)&destination_local);
  sVar3 = pixel_stride_in_local;
  uVar2 = *puVar5;
  for (uStack_50 = 0; uStack_50 < uVar2; uStack_50 = uStack_50 + 1) {
    uVar1 = *(undefined2 *)(sVar3 + uStack_50 * 3);
    local_54 = (byte)uVar1;
    bStack_53 = (byte)((ushort)uVar1 >> 8);
    tVar4 = transform_hp2<unsigned_char>::operator()
                      (transform,local_54 & mask,bStack_53 & mask,
                       *(byte *)(sVar3 + 2 + uStack_50 * 3) & mask);
    local_57 = tVar4.field_0;
    ((anon_union_1_2_7f9ecd68_for_triplet<unsigned_char>_1 *)(pixel_stride_local + uStack_50))->v1 =
         (uchar)local_57;
    aStack_56 = tVar4.field_1;
    ((anon_union_1_2_7f9ecc14_for_triplet<unsigned_char>_3 *)
    (transform_local + pixel_stride_local + uStack_50))->v2 = (uchar)aStack_56;
    ((anon_union_1_2_7f9ecb7a_for_triplet<unsigned_char>_5 *)
    (pixel_stride_local + uStack_50 + (long)transform_local * 2))->v3 = (uchar)tVar4.field_2;
  }
  return;
}

Assistant:

void transform_triplet_to_line(const triplet<PixelType>* source, const size_t pixel_stride_in, PixelType* destination,
                               const size_t pixel_stride, Transform& transform, const uint32_t mask) noexcept
{
    const auto pixel_count{std::min(pixel_stride, pixel_stride_in)};
    const triplet<PixelType>* type_buffer_in{source};

    for (size_t i{}; i < pixel_count; ++i)
    {
        const triplet<PixelType> color{type_buffer_in[i]};
        const triplet<PixelType> color_transformed{transform(color.v1 & mask, color.v2 & mask, color.v3 & mask)};

        destination[i] = color_transformed.v1;
        destination[i + pixel_stride] = color_transformed.v2;
        destination[i + 2 * pixel_stride] = color_transformed.v3;
    }
}